

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_example.cc
# Opt level: O1

void DumpExtensions(ExtensionMap *extension,int indent)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  undefined4 in_register_00000034;
  _Rb_tree_header *p_Var3;
  string local_78;
  undefined8 local_58;
  string local_50;
  
  local_58 = CONCAT44(in_register_00000034,indent);
  p_Var2 = (extension->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(extension->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      Indent_abi_cxx11_(&local_78,(int)local_58);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_78._M_dataplus._M_p,local_78._M_string_length)
      ;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"extensions","");
      PrintValue(&local_78,&local_50,(Value *)(p_Var2 + 2),indent + 1,true);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_78._M_dataplus._M_p,local_78._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

static void DumpExtensions(const tinygltf::ExtensionMap &extension,
                           const int indent) {
  // TODO(syoyo): pritty print Value
  for (auto &e : extension) {
    std::cout << Indent(indent) << e.first << std::endl;
    std::cout << PrintValue("extensions", e.second, indent + 1) << std::endl;
  }
}